

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int acttab_insert(acttab *p,int makeItSafe)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  lookahead_action *plVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  lookahead_action *plVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  
  if (p->nLookahead < 1) {
    __assert_fail("p->nLookahead>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/lemon.c",0x2aa,
                  "int acttab_insert(acttab *, int)");
  }
  uVar7 = p->nActionAlloc;
  iVar3 = p->nsymbol + p->nAction + 1;
  uVar15 = uVar7;
  if ((int)uVar7 <= iVar3) {
    iVar3 = iVar3 + uVar7 + 0x14;
    p->nActionAlloc = iVar3;
    plVar8 = p->aAction;
    plVar4 = (lookahead_action *)realloc(plVar8,(long)iVar3 << 3);
    p->aAction = plVar4;
    if (plVar4 == (lookahead_action *)0x0) {
      acttab_insert_cold_1();
      uVar7 = plVar8->lookahead;
      if (0 < (int)uVar7) {
        do {
          if (-1 < *(int *)((long)plVar8[1] + -8 + (ulong)uVar7 * 8)) {
            return uVar7;
          }
          bVar2 = 1 < (int)uVar7;
          uVar7 = uVar7 - 1;
        } while (bVar2);
        uVar7 = 0;
      }
      return uVar7;
    }
    uVar15 = p->nActionAlloc;
    if ((int)uVar7 < (int)uVar15) {
      memset(plVar4 + (int)uVar7,0xff,(ulong)(~uVar7 + uVar15) * 8 + 8);
    }
  }
  if (makeItSafe == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = p->mnLookahead;
  }
  uVar7 = p->nAction;
  if (iVar3 < (int)uVar7) {
    plVar8 = p->aAction;
    iVar6 = p->mnLookahead;
    iVar9 = iVar6 - uVar7;
    uVar13 = (long)(int)uVar7;
    do {
      iVar9 = iVar9 + 1;
      uVar5 = uVar13 - 1;
      if ((plVar8[uVar13 - 1].lookahead == iVar6) && (plVar8[uVar5].action == p->mnAction)) {
        iVar1 = p->nLookahead;
        if (0 < (long)iVar1) {
          lVar12 = 0;
          do {
            iVar11 = p->aLookahead[lVar12].lookahead;
            uVar14 = (iVar11 - iVar6) + (int)uVar5;
            if (((((int)uVar14 < 0) || ((int)uVar7 <= (int)uVar14)) ||
                (iVar11 != plVar8[uVar14].lookahead)) ||
               (p->aLookahead[lVar12].action != plVar8[uVar14].action)) goto LAB_00102d38;
            lVar12 = lVar12 + 1;
          } while (iVar1 != lVar12);
        }
        if ((int)uVar7 < 1) {
          iVar11 = 0;
        }
        else {
          uVar13 = 0;
          iVar11 = 0;
          do {
            iVar11 = iVar11 + (uint)(iVar9 + (int)uVar13 == plVar8[uVar13].lookahead &&
                                    -1 < plVar8[uVar13].lookahead);
            uVar13 = uVar13 + 1;
          } while (uVar7 != uVar13);
        }
        if (iVar11 == iVar1) goto LAB_00102de1;
      }
LAB_00102d38:
      uVar13 = uVar5;
    } while ((long)iVar3 < (long)uVar5);
  }
  if (makeItSafe == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(uint)p->mnLookahead;
  }
  uVar13 = (long)(int)uVar15 - (long)p->mxLookahead;
  iVar3 = (int)uVar5;
  if (iVar3 < (int)uVar13) {
    plVar8 = p->aAction;
    uVar5 = (ulong)iVar3;
    iVar3 = -iVar3;
    do {
      if (plVar8[uVar5].lookahead < 0) {
        if (0 < (long)p->nLookahead) {
          lVar12 = 0;
          do {
            uVar15 = (p->aLookahead[lVar12].lookahead - p->mnLookahead) + (int)uVar5;
            if (((int)uVar15 < 0) || (-1 < plVar8[uVar15].lookahead)) goto LAB_00102d75;
            lVar12 = lVar12 + 1;
          } while (p->nLookahead != lVar12);
        }
        if ((int)uVar7 < 1) {
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          while (p->mnLookahead + iVar3 + (int)uVar10 != plVar8[uVar10].lookahead) {
            uVar10 = uVar10 + 1;
            if (uVar7 == uVar10) goto LAB_00102de1;
          }
        }
        if ((uint)uVar10 == uVar7) goto LAB_00102de1;
      }
LAB_00102d75:
      uVar5 = uVar5 + 1;
      iVar3 = iVar3 + -1;
    } while ((long)uVar5 < (long)uVar13);
    uVar5 = uVar13 & 0xffffffff;
  }
LAB_00102de1:
  iVar3 = (int)uVar5;
  if (0 < p->nLookahead) {
    lVar12 = 0;
    do {
      iVar6 = (p->aLookahead[lVar12].lookahead - p->mnLookahead) + iVar3;
      p->aAction[iVar6] = p->aLookahead[lVar12];
      uVar7 = p->nAction;
      if ((int)uVar7 <= iVar6) {
        uVar7 = iVar6 + 1;
        p->nAction = uVar7;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < p->nLookahead);
  }
  if ((makeItSafe != 0) && (iVar6 = p->nterminal + iVar3, (int)uVar7 <= iVar6)) {
    p->nAction = iVar6 + 1;
  }
  p->nLookahead = 0;
  return iVar3 - p->mnLookahead;
}

Assistant:

int acttab_insert(acttab *p, int makeItSafe){
  int i, j, k, n, end;
  assert( p->nLookahead>0 );

  /* Make sure we have enough space to hold the expanded action table
  ** in the worst case.  The worst case occurs if the transaction set
  ** must be appended to the current action table
  */
  n = p->nsymbol + 1;
  if( p->nAction + n >= p->nActionAlloc ){
    int oldAlloc = p->nActionAlloc;
    p->nActionAlloc = p->nAction + n + p->nActionAlloc + 20;
    p->aAction = (struct lookahead_action *) realloc( p->aAction,
                          sizeof(p->aAction[0])*p->nActionAlloc);
    if( p->aAction==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
    for(i=oldAlloc; i<p->nActionAlloc; i++){
      p->aAction[i].lookahead = -1;
      p->aAction[i].action = -1;
    }
  }

  /* Scan the existing action table looking for an offset that is a
  ** duplicate of the current transaction set.  Fall out of the loop
  ** if and when the duplicate is found.
  **
  ** i is the index in p->aAction[] where p->mnLookahead is inserted.
  */
  end = makeItSafe ? p->mnLookahead : 0;
  for(i=p->nAction-1; i>=end; i--){
    if( p->aAction[i].lookahead==p->mnLookahead ){
      /* All lookaheads and actions in the aLookahead[] transaction
      ** must match against the candidate aAction[i] entry. */
      if( p->aAction[i].action!=p->mnAction ) continue;
      for(j=0; j<p->nLookahead; j++){
        k = p->aLookahead[j].lookahead - p->mnLookahead + i;
        if( k<0 || k>=p->nAction ) break;
        if( p->aLookahead[j].lookahead!=p->aAction[k].lookahead ) break;
        if( p->aLookahead[j].action!=p->aAction[k].action ) break;
      }
      if( j<p->nLookahead ) continue;

      /* No possible lookahead value that is not in the aLookahead[]
      ** transaction is allowed to match aAction[i] */
      n = 0;
      for(j=0; j<p->nAction; j++){
        if( p->aAction[j].lookahead<0 ) continue;
        if( p->aAction[j].lookahead==j+p->mnLookahead-i ) n++;
      }
      if( n==p->nLookahead ){
        break;  /* An exact match is found at offset i */
      }
    }
  }

  /* If no existing offsets exactly match the current transaction, find an
  ** an empty offset in the aAction[] table in which we can add the
  ** aLookahead[] transaction.
  */
  if( i<end ){
    /* Look for holes in the aAction[] table that fit the current
    ** aLookahead[] transaction.  Leave i set to the offset of the hole.
    ** If no holes are found, i is left at p->nAction, which means the
    ** transaction will be appended. */
    i = makeItSafe ? p->mnLookahead : 0;
    for(; i<p->nActionAlloc - p->mxLookahead; i++){
      if( p->aAction[i].lookahead<0 ){
        for(j=0; j<p->nLookahead; j++){
          k = p->aLookahead[j].lookahead - p->mnLookahead + i;
          if( k<0 ) break;
          if( p->aAction[k].lookahead>=0 ) break;
        }
        if( j<p->nLookahead ) continue;
        for(j=0; j<p->nAction; j++){
          if( p->aAction[j].lookahead==j+p->mnLookahead-i ) break;
        }
        if( j==p->nAction ){
          break;  /* Fits in empty slots */
        }
      }
    }
  }
  /* Insert transaction set at index i. */
#if 0
  printf("Acttab:");
  for(j=0; j<p->nLookahead; j++){
    printf(" %d", p->aLookahead[j].lookahead);
  }
  printf(" inserted at %d\n", i);
#endif
  for(j=0; j<p->nLookahead; j++){
    k = p->aLookahead[j].lookahead - p->mnLookahead + i;
    p->aAction[k] = p->aLookahead[j];
    if( k>=p->nAction ) p->nAction = k+1;
  }
  if( makeItSafe && i+p->nterminal>=p->nAction ) p->nAction = i+p->nterminal+1;
  p->nLookahead = 0;

  /* Return the offset that is added to the lookahead in order to get the
  ** index into yy_action of the action */
  return i - p->mnLookahead;
}